

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O0

void decimate(double *x,int x_length,int r,double *y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double *x_00;
  double *y_00;
  int local_5c;
  int local_58;
  int i_5;
  int count;
  int nbeg;
  int nout;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  double *tmp2;
  double *tmp1;
  int kNFact;
  double *y_local;
  int r_local;
  int x_length_local;
  double *x_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(x_length + 0x12);
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  x_00 = (double *)operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(x_length + 0x12);
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  y_00 = (double *)operator_new__(uVar3);
  for (i_2 = 0; i_2 < 9; i_2 = i_2 + 1) {
    x_00[i_2] = *x + *x + -x[9 - i_2];
  }
  for (i_3 = 9; i_3 < x_length + 9; i_3 = i_3 + 1) {
    x_00[i_3] = x[i_3 + -9];
  }
  for (i_4 = x_length + 9; i_4 < x_length + 0x12; i_4 = i_4 + 1) {
    x_00[i_4] = x[x_length + -1] + x[x_length + -1] + -x[x_length * 2 + (7 - i_4)];
  }
  anon_unknown.dwarf_9083::FilterForDecimate(x_00,x_length + 0x12,r,y_00);
  for (nout = 0; nout < x_length + 0x12; nout = nout + 1) {
    x_00[nout] = y_00[(x_length - nout) + 0x11];
  }
  anon_unknown.dwarf_9083::FilterForDecimate(x_00,x_length + 0x12,r,y_00);
  for (nbeg = 0; nbeg < x_length + 0x12; nbeg = nbeg + 1) {
    x_00[nbeg] = y_00[(x_length - nbeg) + 0x11];
  }
  local_58 = 0;
  for (local_5c = (r - r * ((x_length + -1) / r + 1)) + x_length; local_5c < x_length + 9;
      local_5c = r + local_5c) {
    y[local_58] = x_00[local_5c + 8];
    local_58 = local_58 + 1;
  }
  if (x_00 != (double *)0x0) {
    operator_delete__(x_00);
  }
  if (y_00 != (double *)0x0) {
    operator_delete__(y_00);
  }
  return;
}

Assistant:

void decimate(const double *x, int x_length, int r, double *y) {
  const int kNFact = 9;
  double *tmp1 = new double[x_length + kNFact * 2];
  double *tmp2 = new double[x_length + kNFact * 2];

  for (int i = 0; i < kNFact; ++i) tmp1[i] = 2 * x[0] - x[kNFact - i];
  for (int i = kNFact; i < kNFact + x_length; ++i) tmp1[i] = x[i - kNFact];
  for (int i = kNFact + x_length; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = 2 * x[x_length - 1] - x[x_length - 2 - (i - (kNFact + x_length))];

  FilterForDecimate(tmp1, 2 * kNFact + x_length, r, tmp2);
  for (int i = 0; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = tmp2[2 * kNFact + x_length - i - 1];
  FilterForDecimate(tmp1, 2 * kNFact + x_length, r, tmp2);
  for (int i = 0; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = tmp2[2 * kNFact + x_length - i - 1];

  int nout = (x_length - 1) / r + 1;
  int nbeg = r - r * nout + x_length;

  int count = 0;
  for (int i = nbeg; i < x_length + kNFact; i += r)
    y[count++] = tmp1[i + kNFact - 1];

  delete[] tmp1;
  delete[] tmp2;
}